

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

uint32_t __thiscall
diligent_spirv_cross::Compiler::get_extended_member_decoration
          (Compiler *this,uint32_t type,uint32_t index,ExtendedDecorations decoration)

{
  Decoration *pDVar1;
  Meta *pMVar2;
  ulong uVar3;
  uint32_t *puVar4;
  ulong uVar5;
  uint32_t uVar6;
  ExtendedDecorations local_1c;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)type);
  uVar6 = 0;
  if ((pMVar2 != (Meta *)0x0) &&
     (uVar5 = (ulong)index, uVar6 = 0,
     uVar5 < (pMVar2->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.buffer_size)
     ) {
    pDVar1 = (pMVar2->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.ptr;
    if (decoration < 0x40) {
      uVar3 = 1L << ((byte)decoration & 0x3f) & pDVar1[uVar5].extended.flags.lower;
    }
    else {
      local_1c = decoration;
      uVar3 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&pDVar1[uVar5].extended.flags.higher._M_h,&local_1c);
    }
    if (uVar3 == 0) {
      if (5 < decoration - SPIRVCrossDecorationInterfaceMemberIndex) {
        return 0;
      }
      puVar4 = (uint32_t *)
               (&DAT_00932270 + (ulong)(decoration - SPIRVCrossDecorationInterfaceMemberIndex) * 4);
    }
    else {
      puVar4 = pDVar1[uVar5].extended.values + decoration;
    }
    uVar6 = *puVar4;
  }
  return uVar6;
}

Assistant:

uint32_t Compiler::get_extended_member_decoration(uint32_t type, uint32_t index, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(type);
	if (!m)
		return 0;

	if (index >= m->members.size())
		return 0;

	auto &dec = m->members[index];
	if (!dec.extended.flags.get(decoration))
		return get_default_extended_decoration(decoration);
	return dec.extended.values[decoration];
}